

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

private_dispatcher_handle_t __thiscall
so_5::disp::one_thread::create_private_disp
          (one_thread *this,environment_t *env,string *data_sources_name_base,disp_params_t *params)

{
  disp_params_t *data_sources_name_base_00;
  string *env_00;
  real_private_dispatcher_t *this_00;
  disp_params_t local_50;
  disp_params_t *local_28;
  disp_params_t *params_local;
  string *data_sources_name_base_local;
  environment_t *env_local;
  
  local_28 = params;
  params_local = (disp_params_t *)data_sources_name_base;
  data_sources_name_base_local = (string *)env;
  env_local = (environment_t *)this;
  this_00 = (real_private_dispatcher_t *)operator_new(0x18);
  env_00 = data_sources_name_base_local;
  data_sources_name_base_00 = params_local;
  disp_params_t::disp_params_t(&local_50,params);
  impl::real_private_dispatcher_t::real_private_dispatcher_t
            (this_00,(environment_t *)env_00,(string *)data_sources_name_base_00,&local_50);
  intrusive_ptr_t<so_5::disp::one_thread::private_dispatcher_t>::intrusive_ptr_t
            ((intrusive_ptr_t<so_5::disp::one_thread::private_dispatcher_t> *)this,
             (private_dispatcher_t *)this_00);
  disp_params_t::~disp_params_t(&local_50);
  return (private_dispatcher_handle_t)(private_dispatcher_t *)this;
}

Assistant:

SO_5_FUNC private_dispatcher_handle_t
create_private_disp(
	environment_t & env,
	const std::string & data_sources_name_base,
	disp_params_t params )
{
	return private_dispatcher_handle_t(
			new impl::real_private_dispatcher_t(
					env,
					data_sources_name_base,
					std::move(params) ) );
}